

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall
Catch::LegacyReporterAdapter::assertionEnded
          (LegacyReporterAdapter *this,AssertionStats *assertionStats)

{
  pointer pMVar1;
  IReporter *pIVar2;
  pointer pMVar3;
  AssertionResult result;
  ResultBuilder rb;
  
  if ((assertionStats->assertionResult).m_resultData.resultType != Ok) {
    pMVar1 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pMVar3 = (assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start; pMVar3 != pMVar1; pMVar3 = pMVar3 + 1) {
      if (pMVar3->type == Info) {
        ResultBuilder::ResultBuilder
                  (&rb,(pMVar3->macroName)._M_dataplus._M_p,&pMVar3->lineInfo,"",Normal);
        std::operator<<((ostream *)&rb.m_stream,(string *)&pMVar3->message);
        rb.m_data.resultType = Info;
        ResultBuilder::build(&result,&rb);
        pIVar2 = (this->m_legacyReporter).m_p;
        (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])(pIVar2,&result);
        AssertionResult::~AssertionResult(&result);
        ResultBuilder::~ResultBuilder(&rb);
      }
    }
  }
  pIVar2 = (this->m_legacyReporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])
            (pIVar2,&assertionStats->assertionResult);
  return true;
}

Assistant:

bool LegacyReporterAdapter::assertionEnded( AssertionStats const& assertionStats ) {
        if( assertionStats.assertionResult.getResultType() != ResultWas::Ok ) {
            for( std::vector<MessageInfo>::const_iterator it = assertionStats.infoMessages.begin(), itEnd = assertionStats.infoMessages.end();
                    it != itEnd;
                    ++it ) {
                if( it->type == ResultWas::Info ) {
                    ResultBuilder rb( it->macroName.c_str(), it->lineInfo, "", ResultDisposition::Normal );
                    rb << it->message;
                    rb.setResultType( ResultWas::Info );
                    AssertionResult result = rb.build();
                    m_legacyReporter->Result( result );
                }
            }
        }
        m_legacyReporter->Result( assertionStats.assertionResult );
        return true;
    }